

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O1

QWindow * __thiscall QFbScreen::topLevelAt(QFbScreen *this,QPoint *p)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QWindow *local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x30);
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 0x28);
    lVar5 = 0;
    do {
      auVar6 = (**(code **)(**(long **)(lVar2 + lVar5) + 0x30))(*(long **)(lVar2 + lVar5));
      local_48 = auVar6;
      cVar4 = QRect::contains((QPoint *)local_48,SUB81(p,0));
      if (cVar4 == '\0') {
        bVar3 = true;
      }
      else {
        QPlatformWindow::window();
        cVar4 = QWindow::isVisible();
        bVar3 = true;
        if (cVar4 != '\0') {
          local_50 = (QWindow *)QPlatformWindow::window();
          bVar3 = false;
        }
      }
      if (!bVar3) goto LAB_0011d3c7;
      lVar5 = lVar5 + 8;
    } while (lVar1 << 3 != lVar5);
  }
  local_50 = (QWindow *)0x0;
LAB_0011d3c7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

QWindow *QFbScreen::topLevelAt(const QPoint & p) const
{
    for (QFbWindow *fbw : mWindowStack) {
        if (fbw->geometry().contains(p, false) && fbw->window()->isVisible())
            return fbw->window();
    }
    return nullptr;
}